

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O0

void __thiscall
QtPrivate::QGenericArrayOps<QLinuxFbDevice::Output>::copyAppend
          (QGenericArrayOps<QLinuxFbDevice::Output> *this,Output *b,Output *e)

{
  ulong in_RDX;
  ulong in_RSI;
  long in_RDI;
  Output *data;
  undefined8 local_10;
  
  if (in_RSI != in_RDX) {
    QArrayDataPointer<QLinuxFbDevice::Output>::begin
              ((QArrayDataPointer<QLinuxFbDevice::Output> *)0x120997);
    local_10 = in_RSI;
    while (local_10 < in_RDX) {
      QLinuxFbDevice::Output::Output((Output *)this,b);
      local_10 = local_10 + 0x170;
      *(long *)(in_RDI + 0x10) = *(long *)(in_RDI + 0x10) + 1;
    }
  }
  return;
}

Assistant:

void copyAppend(const T *b, const T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e) // short-cut and handling the case b and e == nullptr
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(*b);
            ++b;
            ++this->size;
        }
    }